

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_mri.c
# Opt level: O3

int ff(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 *puVar4;
  
  dVar1 = *(double *)((long)user_data + 8);
  puVar4 = *(undefined8 **)((long)ydot->content + 0x10);
  dVar2 = *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  dVar3 = *(double *)((long)user_data + 0x10);
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = (dVar1 - dVar2) / dVar3;
  return 0;
}

Assistant:

static int ff(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype b  = rdata[1];                    /* access data entries */
  sunrealtype ep = rdata[2];
  sunrealtype w  = NV_Ith_S(y, 2); /* access solution values */

  /* fill in the RHS function */
  NV_Ith_S(ydot, 0) = 0.0;
  NV_Ith_S(ydot, 1) = 0.0;
  NV_Ith_S(ydot, 2) = (b - w) / ep;

  /* Return with success */
  return 0;
}